

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.cc
# Opt level: O1

ssize_t __thiscall iqxmlrpc::Parser::Impl::read(Impl *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  long lVar4;
  Parse_error *this_00;
  undefined4 in_register_00000034;
  char *__s;
  bool bVar5;
  allocator<char> local_49;
  string local_48;
  
  if (this->pushed_back == true) {
    this->pushed_back = false;
  }
  else if ((this->curr).is_empty == true) {
    (this->curr).element_begin = false;
    (this->curr).element_end = true;
    (this->curr).is_empty = false;
  }
  else {
    iVar1 = xmlTextReaderRead(this->reader,CONCAT44(in_register_00000034,__fd));
    (this->curr).done = true;
    if (iVar1 < 0) {
      lVar4 = xmlGetLastError();
      this_00 = (Parse_error *)__cxa_allocate_exception(0x18);
      if (lVar4 == 0) {
        __s = "unknown parsing error";
      }
      else {
        __s = *(char **)(lVar4 + 8);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_49);
      Parse_error::Parse_error(this_00,&local_48);
      __cxa_throw(this_00,&Parse_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (iVar1 != 0) {
      iVar1 = xmlTextReaderNodeType(this->reader);
      if (iVar1 == 1) {
        iVar2 = xmlTextReaderIsEmptyElement(this->reader);
        bVar5 = iVar2 != 0;
      }
      else {
        bVar5 = false;
      }
      (this->curr).done = false;
      (this->curr).element_begin = iVar1 == 1;
      (this->curr).element_end = iVar1 == 0xf;
      (this->curr).is_empty = bVar5;
      (this->curr).is_text = iVar1 == 3;
    }
  }
  sVar3._0_1_ = (this->curr).done;
  sVar3._1_1_ = (this->curr).element_begin;
  sVar3._2_1_ = (this->curr).element_end;
  sVar3._3_1_ = (this->curr).is_empty;
  sVar3._4_1_ = (this->curr).is_text;
  sVar3._5_1_ = this->pushed_back;
  sVar3._6_2_ = *(undefined2 *)&this->field_0x2e;
  return sVar3;
}

Assistant:

ParseStep
  read()
  {
    if (pushed_back) {
      pushed_back = false;
      return curr;
    }

    if (curr.is_empty) {
      curr.element_begin = false;
      curr.element_end = true;
      curr.is_empty = false;
      return curr;
    }

    int code = xmlTextReaderRead(reader);
    curr.done = true;

    if (code < 0) {
      xmlErrorPtr err = xmlGetLastError();
      throw Parse_error(err ? err->message : "unknown parsing error");
    }

    if (code > 0) {
      curr = ParseStep(node_type(), reader);
    }

    return curr;
  }